

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O2

void jpgd::jpeg_decoder::decode_block_ac_first
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  int iVar1;
  coeff_buf *pcVar2;
  uint8 *puVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint num_bits;
  
  iVar6 = pD->m_eob_run;
  if (iVar6 == 0) {
    pcVar2 = pD->m_ac_coeffs[component_id];
    iVar6 = pcVar2->block_size;
    puVar3 = pcVar2->pData;
    iVar1 = pcVar2->block_num_x;
    iVar8 = pD->m_spectral_start;
    while (iVar8 <= pD->m_spectral_end) {
      uVar4 = huff_decode(pD,pD->m_pHuff_tabs[pD->m_comp_ac_tab[component_id]]);
      iVar7 = (int)uVar4 >> 4;
      num_bits = uVar4 & 0xf;
      if (num_bits == 0) {
        if (iVar7 != 0xf) {
          iVar6 = 1 << ((byte)iVar7 & 0x1f);
          pD->m_eob_run = iVar6;
          if (0xf < uVar4) {
            uVar5 = get_bits_no_markers(pD,iVar7);
            iVar6 = uVar5 + pD->m_eob_run;
          }
          goto LAB_0011c002;
        }
        if (0x30 < iVar8) goto LAB_0011c10b;
        iVar7 = iVar8 + 0xf;
      }
      else {
        iVar7 = iVar7 + iVar8;
        if (0x3f < iVar7) {
LAB_0011c10b:
          stop_decoding(pD,JPGD_DECODE_ERROR);
        }
        uVar5 = get_bits_no_markers(pD,num_bits);
        if ((int)uVar5 < *(int *)(s_extend_test + (ulong)num_bits * 4)) {
          uVar5 = uVar5 + *(int *)(s_extend_offset + (ulong)num_bits * 4);
        }
        *(short *)(puVar3 + (long)*(int *)(g_ZAG + (long)iVar7 * 4) * 2 +
                            (long)(block_y * iVar6 * iVar1) + (long)(block_x * iVar6)) =
             (short)(uVar5 << ((byte)pD->m_successive_low & 0x1f));
      }
      iVar8 = iVar7 + 1;
    }
  }
  else {
LAB_0011c002:
    pD->m_eob_run = iVar6 + -1;
  }
  return;
}

Assistant:

void jpeg_decoder::decode_block_ac_first(jpeg_decoder* pD, int component_id, int block_x, int block_y) {
  int k, s, r;

  if (pD->m_eob_run) {
    pD->m_eob_run--;
    return;
  }

  jpgd_block_t* p = pD->coeff_buf_getp(pD->m_ac_coeffs[component_id], block_x, block_y);

  for (k = pD->m_spectral_start; k <= pD->m_spectral_end; k++) {
    s = pD->huff_decode(pD->m_pHuff_tabs[pD->m_comp_ac_tab[component_id]]);

    r = s >> 4;
    s &= 15;

    if (s) {
      if ((k += r) > 63)
        pD->stop_decoding(JPGD_DECODE_ERROR);

      r = pD->get_bits_no_markers(s);
      s = JPGD_HUFF_EXTEND(r, s);

      p[g_ZAG[k]] = static_cast<jpgd_block_t>(s << pD->m_successive_low);
    } else {
      if (r == 15) {
        if ((k += 15) > 63)
          pD->stop_decoding(JPGD_DECODE_ERROR);
      } else {
        pD->m_eob_run = 1 << r;

        if (r)
          pD->m_eob_run += pD->get_bits_no_markers(r);

        pD->m_eob_run--;

        break;
      }
    }
  }
}